

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_channels.cpp
# Opt level: O2

ON_wString GetSortedSemicolonDelimitedString(ON_SimpleArray<ON_UUID_struct> *chan)

{
  long in_RSI;
  int i_1;
  long lVar1;
  int i;
  long lVar2;
  ON_ClassArray<ON_wString> a;
  ON_ClassArray<ON_wString> local_40;
  
  ON_wString::ON_wString((ON_wString *)chan);
  local_40._vptr_ON_ClassArray = (_func_int **)&PTR__ON_ClassArray_0081b0a8;
  local_40.m_a = (ON_wString *)0x0;
  local_40.m_count = 0;
  local_40.m_capacity = 0;
  lVar1 = 0;
  for (lVar2 = 0; lVar2 < *(int *)(in_RSI + 0x10); lVar2 = lVar2 + 1) {
    ON_UuidToString((ON_UUID *)(*(long *)(in_RSI + 8) + lVar1),(ON_wString *)chan);
    ON_ClassArray<ON_wString>::Append(&local_40,(ON_wString *)chan);
    lVar1 = lVar1 + 0x10;
  }
  ON_ClassArray<ON_wString>::QuickSort(&local_40,ON_CompareIncreasing<ON_wString>);
  ON_wString::operator=((ON_wString *)chan,L"");
  lVar2 = 0;
  for (lVar1 = 0; lVar1 < local_40.m_count; lVar1 = lVar1 + 1) {
    ON_wString::operator+=((ON_wString *)chan,(ON_wString *)((long)&(local_40.m_a)->m_s + lVar2));
    if (lVar1 < (long)local_40.m_count + -1) {
      ON_wString::operator+=((ON_wString *)chan,L";");
    }
    lVar2 = lVar2 + 8;
  }
  ON_ClassArray<ON_wString>::~ON_ClassArray(&local_40);
  return (ON_wString)(wchar_t *)chan;
}

Assistant:

static ON_wString GetSortedSemicolonDelimitedString(const ON_SimpleArray<ON_UUID>& chan)
{
  ON_wString s;

  ON_ClassArray<ON_wString> a;

  for (int i = 0; i < chan.Count(); i++)
  {
    ON_UuidToString(chan[i], s);
    a.Append(s);
  }

  a.QuickSort(ON_CompareIncreasing);

  s = L"";
  for (int i = 0; i < a.Count(); i++)
  {
    s += a[i];
    if (i < (a.Count() - 1))
      s += L";";
  }

  return s;
}